

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O0

TypedAttribute<Imf_3_4::Rational> *
Imf_3_4::TypedAttribute<Imf_3_4::Rational>::cast(Attribute *attribute)

{
  TypeExc *this;
  long in_RDI;
  TypedAttribute<Imf_3_4::Rational> *t;
  TypedAttribute<Imf_3_4::Rational> *local_30;
  
  if (in_RDI == 0) {
    local_30 = (TypedAttribute<Imf_3_4::Rational> *)0x0;
  }
  else {
    local_30 = (TypedAttribute<Imf_3_4::Rational> *)
               __dynamic_cast(in_RDI,&Attribute::typeinfo,&typeinfo,0);
  }
  if (local_30 == (TypedAttribute<Imf_3_4::Rational> *)0x0) {
    this = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::TypeExc::TypeExc(this,"Unexpected attribute type.");
    __cxa_throw(this,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
  }
  return local_30;
}

Assistant:

TypedAttribute<T>*
TypedAttribute<T>::cast (Attribute* attribute)
{
    TypedAttribute<T>* t = dynamic_cast<TypedAttribute<T>*> (attribute);

    if (t == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return t;
}